

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::IntStateScatterReactions
          (ChLinkRevoluteTranslational *this,uint off_L,ChVectorDynamic<> *L)

{
  int iVar1;
  CoeffReturnType pdVar2;
  undefined1 auVar3 [32];
  
  iVar1 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    this->m_multipliers[0] = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    this->m_multipliers[1] = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    this->m_multipliers[2] = *pdVar2;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 3));
    this->m_multipliers[3] = *pdVar2;
    auVar3 = ZEXT832(0) << 0x20;
    *(undefined1 (*) [32])((this->super_ChLink).react_force.m_data + 2) = auVar3;
    (this->super_ChLink).react_force = (ChVector<double>)auVar3._0_24_;
    (this->super_ChLink).react_torque.m_data[0] = (double)auVar3._24_8_;
  }
  return;
}

Assistant:

void ChLinkRevoluteTranslational::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);

    // Also compute 'intuitive' reactions:
    ////double lam_par1 = m_multipliers[0];
    ////double lam_par2 = m_multipliers[1];
    ////double lam_dot = m_multipliers[2];
    ////double lam_dist = m_multipliers[3];

    ////
    //// TODO
    ////

    // Calculate the reaction torques and forces on Body 2 in the joint frame
    // (Note: origin of the joint frame is at the center of the revolute joint
    //  which is defined on body 1, the x-axis is along the vector from the
    //  point on body 1 to the point on body 2.  The z axis is along the revolute
    //  axis defined for the joint)
    react_force.x() = 0;
    react_force.y() = 0;
    react_force.z() = 0;

    react_torque.x() = 0;
    react_torque.y() = 0;
    react_torque.z() = 0;
}